

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_byte_for_non_strings.cpp
# Opt level: O0

int main(void)

{
  iterator pvVar1;
  ostream *poVar2;
  value_type *byte;
  iterator __end1;
  iterator __begin1;
  array<std::byte,_3UL> *__range1;
  array<std::byte,_3UL> bytes;
  
  __range1._4_4_ = 0;
  __range1._1_2_ = 0x4141;
  __range1._3_1_ = 0x41;
  __end1 = std::array<std::byte,_3UL>::begin((array<std::byte,_3UL> *)((long)&__range1 + 1));
  pvVar1 = std::array<std::byte,_3UL>::end((array<std::byte,_3UL> *)((long)&__range1 + 1));
  for (; __end1 != pvVar1; __end1 = __end1 + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,*__end1);
    std::operator<<(poVar2,"\n");
  }
  return __range1._4_4_;
}

Assistant:

int main() {
  std::array<std::byte, 3> bytes = {
    std::byte{ 0x41 },
    std::byte{ 0x41 },
    std::byte{ 0x41 }
  };
  for (auto const & byte : bytes) {
    std::cout << static_cast<unsigned char>(byte) << "\n";
  }
}